

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall
sznet::net::TcpConnection::TcpConnection
          (TcpConnection *this,EventLoop *loop,string *nameArg,uint32_t id,sz_sock sockfd,
          InetAddress *localAddr,InetAddress *peerAddr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  sz_sock sVar4;
  EventLoop *pEVar5;
  Socket *pSVar6;
  Channel *pCVar7;
  Timestamp TVar8;
  self *psVar9;
  LogStream *this_00;
  undefined1 auVar11 [24];
  undefined1 auVar10 [64];
  SourceFile file;
  SourceFile file_00;
  undefined1 local_10c0 [4048];
  SourceFile local_f0;
  function<void_(sznet::Timestamp)> local_e0;
  function<void_()> local_c0;
  function<void_()> local_a0;
  function<void_()> local_80;
  undefined1 local_60 [2] [12];
  unique_ptr<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_> *local_48;
  InetAddress *local_40;
  sz_sock local_38;
  
  (this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
  super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<sznet::net::TcpConnection>)._M_weak_this.
  super___weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = localAddr;
  local_38 = sockfd;
  Logger::SourceFile::SourceFile<104>
            (&local_f0,
             (char (*) [104])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_f0.m_size;
  file._8_8_ = 0x1f;
  pEVar5 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_f0.m_data,file,0x132832,(char *)loop,(EventLoop *)localAddr);
  this->m_loop = pEVar5;
  std::__cxx11::string::string((string *)&this->m_name,(string *)nameArg);
  this->m_id = id;
  this->m_state = kConnecting;
  this->m_reading = true;
  pSVar6 = (Socket *)operator_new(8);
  sVar4 = local_38;
  local_48 = &this->m_socket;
  pSVar6->m_sockfd = local_38;
  pSVar6->m_ableClose = true;
  (this->m_socket)._M_t.
  super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>.
  super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl = pSVar6;
  pCVar7 = (Channel *)operator_new(0xb8);
  Channel::Channel(pCVar7,loop,sVar4);
  (this->m_channel)._M_t.
  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
  super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl = pCVar7;
  uVar1 = *(undefined8 *)((long)&local_40->field_0 + 8);
  uVar2 = *(undefined8 *)((long)&local_40->field_0 + 0xc);
  uVar3 = *(undefined8 *)((long)&local_40->field_0 + 0x14);
  *(undefined8 *)&(this->m_localAddr).field_0 = *(undefined8 *)&local_40->field_0;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 8) = uVar1;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0xc) = uVar2;
  *(undefined8 *)((long)&(this->m_localAddr).field_0 + 0x14) = uVar3;
  uVar1 = *(undefined8 *)((long)&peerAddr->field_0 + 8);
  uVar2 = *(undefined8 *)((long)&peerAddr->field_0 + 0xc);
  uVar3 = *(undefined8 *)((long)&peerAddr->field_0 + 0x14);
  *(undefined8 *)&(this->m_peerAddr).field_0 = *(undefined8 *)&peerAddr->field_0;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 8) = uVar1;
  auVar10 = ZEXT864(0) << 0x20;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0xc) = uVar2;
  *(undefined8 *)((long)&(this->m_peerAddr).field_0 + 0x14) = uVar3;
  auVar11 = SUB3224(auVar10._0_32_,0);
  (this->m_writeCompleteCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_writeCompleteCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_writeCompleteCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._0_32_,0x18);
  auVar11 = SUB3224(auVar10._32_32_,0);
  (this->m_highWaterMarkCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_highWaterMarkCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_highWaterMarkCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._32_32_,0x18);
  auVar11 = SUB3224(auVar10._0_32_,0);
  (this->m_connectionCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_connectionCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_connectionCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._0_32_,0x18);
  auVar11 = SUB3224(auVar10._32_32_,0);
  (this->m_messageCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_messageCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_messageCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._32_32_,0x18);
  auVar11 = SUB3224(auVar10._0_32_,0);
  (this->m_highWaterMarkCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_highWaterMarkCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_highWaterMarkCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._0_32_,0x18);
  auVar11 = SUB3224(auVar10._32_32_,0);
  (this->m_closeCallback).super__Function_base._M_functor = (_Any_data)auVar11._0_16_;
  (this->m_closeCallback).super__Function_base._M_manager = (_Manager_type)auVar11._16_8_;
  (this->m_closeCallback)._M_invoker = (_Invoker_type)SUB328(auVar10._32_32_,0x18);
  this->m_highWaterMark = 0x4000000;
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_outputBuffer,4,0x400);
  (this->m_netStatInfo).m_recvBytes = 0;
  (this->m_netStatInfo).m_sendBytes = 0;
  (this->m_prevNetStatInfo).m_recvBytes = 0;
  (this->m_prevNetStatInfo).m_sendBytes = 0;
  TVar8 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar8.m_microSecondsSinceEpoch;
  pCVar7 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_10c0._0_8_ = handleRead;
  local_10c0._8_8_ = 0;
  local_10c0._16_8_ = this;
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,std::_Placeholder<1>))(sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_e0,
             (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::_Placeholder<1>))(sznet::Timestamp)>
              *)local_10c0);
  std::function<void_(sznet::Timestamp)>::operator=(&pCVar7->m_readCallback,&local_e0);
  std::_Function_base::~_Function_base(&local_e0.super__Function_base);
  pCVar7 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_10c0._0_8_ = handleWrite;
  local_10c0._8_8_ = 0;
  local_10c0._16_8_ = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_c0,
             (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()> *)local_10c0
            );
  std::function<void_()>::operator=(&pCVar7->m_writeCallback,&local_c0);
  std::_Function_base::~_Function_base(&local_c0.super__Function_base);
  pCVar7 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_10c0._0_8_ = handleClose;
  local_10c0._8_8_ = 0;
  local_10c0._16_8_ = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_a0,
             (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()> *)local_10c0
            );
  std::function<void_()>::operator=(&pCVar7->m_closeCallback,&local_a0);
  std::_Function_base::~_Function_base(&local_a0.super__Function_base);
  pCVar7 = (this->m_channel)._M_t.
           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
           _M_t.
           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
           super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
  local_10c0._0_8_ = handleError;
  local_10c0._8_8_ = 0;
  local_10c0._16_8_ = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*))()>,void>
            ((function<void()> *)&local_80,
             (_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*))()> *)local_10c0
            );
  std::function<void_()>::operator=(&pCVar7->m_errorCallback,&local_80);
  std::_Function_base::~_Function_base(&local_80.super__Function_base);
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_60,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_60[0]._0_8_;
    file_00.m_size = local_60[0]._8_4_;
    Logger::Logger((Logger *)local_10c0,file_00,0x33,DEBUG,"TcpConnection");
    psVar9 = LogStream::operator<<((LogStream *)(local_10c0 + 8),"TcpConnection::ctor[");
    sVar4 = local_38;
    psVar9 = LogStream::operator<<(psVar9,&this->m_name);
    psVar9 = LogStream::operator<<(psVar9,"] at ");
    this_00 = LogStream::operator<<(psVar9,this);
    psVar9 = LogStream::operator<<(this_00," fd=");
    LogStream::operator<<(psVar9,sVar4);
    Logger::~Logger((Logger *)local_10c0);
  }
  Socket::setKeepAlive
            ((local_48->_M_t).
             super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>.
             _M_t.
             super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>.
             super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl,true);
  return;
}

Assistant:

TcpConnection::TcpConnection(EventLoop* loop, const string& nameArg, const uint32_t id, sockets::sz_sock sockfd, const InetAddress& localAddr, const InetAddress& peerAddr): 
	m_loop(CHECK_NOTNULL(loop)),
	m_name(nameArg),
	m_id(id),
	m_state(kConnecting),
	m_reading(true),
	m_socket(new Socket(sockfd)),
	m_channel(new Channel(loop, sockfd)),
	m_localAddr(localAddr),
	m_peerAddr(peerAddr),
	m_highWaterMark(64 * 1024 * 1024),
	m_calcNetLastTime(Timestamp::now())
{
	// ���ÿɶ�
	m_channel->setReadCallback(std::bind(&TcpConnection::handleRead, this, std::placeholders::_1));
	// ���ÿ�д
	m_channel->setWriteCallback(std::bind(&TcpConnection::handleWrite, this));
	// ���ùر�
	m_channel->setCloseCallback(std::bind(&TcpConnection::handleClose, this));
	// ���ô���
	m_channel->setErrorCallback(std::bind(&TcpConnection::handleError, this));
	LOG_DEBUG << "TcpConnection::ctor[" << m_name << "] at " << this << " fd=" << sockfd;
	// ��������
	m_socket->setKeepAlive(true);
}